

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.h
# Opt level: O1

RGB __thiscall pbrt::RGBColorSpace::ToRGB(RGBColorSpace *this,XYZ *xyz)

{
  undefined1 auVar1 [16];
  XYZ *pXVar2;
  SquareMatrix<3> *pSVar3;
  int i;
  int iVar4;
  long lVar5;
  int j;
  Float *pFVar6;
  long lVar7;
  RGB RVar8;
  Float local_1c;
  undefined8 local_18;
  
  pSVar3 = &this->RGBFromXYZ;
  local_18 = 0;
  local_1c = 0.0;
  lVar5 = 0;
  do {
    iVar4 = (int)lVar5;
    pFVar6 = (Float *)&local_18;
    if ((iVar4 != 0) && (pFVar6 = (Float *)((long)&local_18 + 4), iVar4 != 1)) {
      pFVar6 = &local_1c;
    }
    *pFVar6 = 0.0;
    lVar7 = 0;
    do {
      pXVar2 = xyz;
      if (((int)lVar7 != 0) && (pXVar2 = (XYZ *)&xyz->Y, (int)lVar7 != 1)) {
        pXVar2 = (XYZ *)&xyz->Z;
      }
      pFVar6 = (Float *)&local_18;
      if ((iVar4 != 0) && (pFVar6 = (Float *)((long)&local_18 + 4), iVar4 != 1)) {
        pFVar6 = &local_1c;
      }
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)pXVar2->X),ZEXT416((uint)pSVar3->m[0][lVar7]),
                               ZEXT416((uint)*pFVar6));
      *pFVar6 = auVar1._0_4_;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar5 = lVar5 + 1;
    pSVar3 = (SquareMatrix<3> *)(pSVar3->m + 1);
  } while (lVar5 != 3);
  RVar8.b = local_1c;
  RVar8.r = (Float)(undefined4)local_18;
  RVar8.g = (Float)local_18._4_4_;
  return RVar8;
}

Assistant:

PBRT_CPU_GPU
    RGB ToRGB(const XYZ &xyz) const { return Mul<RGB>(RGBFromXYZ, xyz); }